

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.c
# Opt level: O0

void stdout_anything(t_stdout *x,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  size_t sVar2;
  char *ep;
  char *sp;
  char msgbuf [1000];
  t_atom *local_28;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_stdout *x_local;
  
  if (x->x_mode == 2) {
    ptVar1 = gensym("list");
    if (((ptVar1 == s) || (ptVar1 = gensym("float"), ptVar1 == s)) ||
       (ptVar1 = gensym("bang"), ptVar1 == s)) {
      stdout_binary(x,argc,argv);
    }
    else {
      pd_error(x,"stdout: only \'list\' messages allowed in binary mode (got \'%s\')",s->s_name);
    }
  }
  else if (x->x_mode == 3) {
    pd_tilde_putsymbol(s,(FILE *)_stdout);
    local_28 = argv;
    argv_local._4_4_ = argc;
    while (argv_local._4_4_ != 0) {
      if (local_28->a_type == A_FLOAT) {
        pd_tilde_putfloat((local_28->a_w).w_float,(FILE *)_stdout);
      }
      else if (local_28->a_type == A_SYMBOL) {
        pd_tilde_putsymbol((local_28->a_w).w_symbol,(FILE *)_stdout);
      }
      local_28 = local_28 + 1;
      argv_local._4_4_ = argv_local._4_4_ + -1;
    }
    putc(4,_stdout);
    if (x->x_flush != 0) {
      fflush(_stdout);
    }
  }
  else {
    sp._0_1_ = 0;
    strncpy((char *)&sp,s->s_name,1000);
    msgbuf[0x3df] = '\0';
    sVar2 = strlen((char *)&sp);
    ep = msgbuf + (sVar2 - 8);
    local_28 = argv;
    argv_local._4_4_ = argc;
    while (argv_local._4_4_ != 0) {
      if (ep < msgbuf + 0x3df) {
        *ep = ' ';
        ep[1] = '\0';
        ep = ep + 1;
      }
      atom_string(local_28,ep,((int)msgbuf + 0x3e0) - (int)ep);
      sVar2 = strlen(ep);
      ep = ep + sVar2;
      local_28 = local_28 + 1;
      argv_local._4_4_ = argv_local._4_4_ + -1;
    }
    if (x->x_mode == 1) {
      printf("%s\n",&sp);
    }
    else {
      printf("%s;\n",&sp);
    }
    if (x->x_flush != 0) {
      fflush(_stdout);
    }
  }
  return;
}

Assistant:

static void stdout_anything(t_stdout *x, t_symbol *s, int argc, t_atom *argv)
{
    char msgbuf[MAXPDSTRING], *sp, *ep = msgbuf+MAXPDSTRING;
    if (x->x_mode == MODE_BIN)
    {
        if ((gensym("list") == s) || (gensym("float") == s) ||
            (gensym("bang") == s))
                stdout_binary(x, argc, argv);
        else
            pd_error(x,
 "stdout: only 'list' messages allowed in binary mode (got '%s')",
                s->s_name);
        return;
    }
    else if (x->x_mode == MODE_PDTILDE)
    {
        pd_tilde_putsymbol(s, stdout);
        for (; argc--; argv++)
        {
            if (argv->a_type == A_FLOAT)
                pd_tilde_putfloat(argv->a_w.w_float, stdout);
            else if (argv->a_type == A_SYMBOL)
                pd_tilde_putsymbol(argv->a_w.w_symbol, stdout);
        }
        putc(A_SEMI, stdout);
        if (x->x_flush)
            fflush(stdout);
        return;
    }
    msgbuf[0] = 0;
    strncpy(msgbuf, s->s_name, MAXPDSTRING);
    msgbuf[MAXPDSTRING-1] = 0;
    sp = msgbuf + strlen(msgbuf);
    while (argc--)
    {
        if (sp < ep-1)
            sp[0] = ' ', sp[1] = 0, sp++;
        atom_string(argv++, sp, (unsigned int)(ep-sp));
        sp += strlen(sp);
    }
    switch(x->x_mode) {
    case MODE_CR:
        printf("%s\n", msgbuf);
        break;
    default:
        printf("%s;\n", msgbuf);
    }
    if (x->x_flush)
        fflush(stdout);
}